

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_intern.c
# Opt level: O0

void bn_set_static_words(BIGNUM *a,unsigned_long *words,int size)

{
  int in_EDX;
  unsigned_long *in_RSI;
  BIGNUM *in_RDI;
  
  in_RDI->d = in_RSI;
  in_RDI->top = in_EDX;
  in_RDI->dmax = in_EDX;
  in_RDI->neg = 0;
  in_RDI->flags = in_RDI->flags | 2;
  bn_correct_top(in_RDI);
  return;
}

Assistant:

void bn_set_static_words(BIGNUM *a, const BN_ULONG *words, int size)
{
    /*
     * |const| qualifier omission is compensated by BN_FLG_STATIC_DATA
     * flag, which effectively means "read-only data".
     */
    a->d = (BN_ULONG *)words;
    a->dmax = a->top = size;
    a->neg = 0;
    a->flags |= BN_FLG_STATIC_DATA;
    bn_correct_top(a);
}